

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O0

char * ll_bcsym(void *lib,char *sym)

{
  char *pcVar1;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 local_8;
  
  local_8 = in_RDI;
  if (in_RDI == 0) {
    local_8 = 0;
  }
  pcVar1 = (char *)dlsym(local_8,in_RSI);
  return pcVar1;
}

Assistant:

static const char *ll_bcsym(void *lib, const char *sym)
{
#if defined(RTLD_DEFAULT)
  if (lib == NULL) lib = RTLD_DEFAULT;
#elif LJ_TARGET_OSX || LJ_TARGET_BSD
  if (lib == NULL) lib = (void *)(intptr_t)-2;
#endif
  return (const char *)dlsym(lib, sym);
}